

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

string * __thiscall
pbrt::FindMatchingNamedSpectrum_abi_cxx11_
          (string *__return_storage_ptr__,pbrt *this,SpectrumHandle *s)

{
  string *psVar1;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  Float FVar4;
  allocator<char> local_59;
  Float local_58;
  float local_54;
  string *local_50;
  pbrt *local_48;
  SpectrumHandle local_40;
  SpectrumHandle local_38;
  
  p_Var2 = (_Rb_tree_node_base *)Spectra::(anonymous_namespace)::namedSpectra_abi_cxx11_._24_8_;
  local_50 = __return_storage_ptr__;
  local_48 = this;
  do {
    psVar1 = local_50;
    if (p_Var2 == (_Rb_tree_node_base *)
                  (Spectra::(anonymous_namespace)::namedSpectra_abi_cxx11_ + 8)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"",&local_59);
      return psVar1;
    }
    local_38.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = *(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
              *)local_48;
    lVar3 = 0;
    local_40.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = *(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
              *)(p_Var2 + 2);
    do {
      psVar1 = local_50;
      if (lVar3 == 0x38) {
        std::__cxx11::string::string((string *)local_50,(string *)(p_Var2 + 1));
        return psVar1;
      }
      local_58 = *(Float *)((long)&DAT_00440980 + lVar3);
      local_54 = SpectrumHandle::operator()(&local_38,local_58);
      FVar4 = SpectrumHandle::operator()(&local_40,local_58);
      lVar3 = lVar3 + 4;
    } while ((local_54 == FVar4) && (!NAN(local_54) && !NAN(FVar4)));
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

std::string FindMatchingNamedSpectrum(SpectrumHandle s) {
    auto sampledLambdasMatch = [](SpectrumHandle a, SpectrumHandle b) {
        const Float wls[] = {306, 360.932007, 380, 402, 455, 503, 579,
                             610, 660,        692, 702, 760, 800, 860};
        for (Float lambda : wls)
            if (a(lambda) != b(lambda))
                return false;
        return true;
    };
    for (const auto &spd : Spectra::namedSpectra) {
        if (sampledLambdasMatch(s, spd.second))
            return spd.first;
    }
    return "";
}